

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

xmlChar * xmlCatalogLocalResolveURI(void *catalogs,xmlChar *URI)

{
  xmlChar *pxVar1;
  
  if (URI == (xmlChar *)0x0) {
    return (xmlChar *)0x0;
  }
  if (xmlDebugCatalogs != 0) {
    xmlCatalogPrintDebug("Resolve URI %s\n",URI);
  }
  if ((catalogs != (void *)0x0) &&
     (pxVar1 = xmlCatalogListXMLResolveURI((xmlCatalogEntryPtr)catalogs,URI),
     &DAT_00000001 < pxVar1 + 1)) {
    return pxVar1;
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlCatalogLocalResolveURI(void *catalogs, const xmlChar *URI) {
    xmlCatalogEntryPtr catal;
    xmlChar *ret;

    if (URI == NULL)
	return(NULL);

    if (xmlDebugCatalogs)
	xmlCatalogPrintDebug(
		"Resolve URI %s\n", URI);

    catal = (xmlCatalogEntryPtr) catalogs;
    if (catal == NULL)
	return(NULL);
    ret = xmlCatalogListXMLResolveURI(catal, URI);
    if ((ret != NULL) && (ret != XML_CATAL_BREAK))
	return(ret);
    return(NULL);
}